

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void libcellml::flattenComponentImports
               (ComponentEntityPtr *parent,ComponentPtr *component,size_t componentIndex)

{
  element_type *peVar1;
  size_t sVar2;
  shared_ptr<libcellml::ComponentEntity> local_68;
  undefined1 local_58 [8];
  ComponentPtr c;
  ulong local_38;
  size_t index;
  ComponentPtr flattenedComponent;
  size_t componentIndex_local;
  ComponentPtr *component_local;
  ComponentEntityPtr *parent_local;
  
  flattenedComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)componentIndex;
  flattenComponent((ComponentEntityPtr *)&index,(ComponentPtr *)parent,(size_t)component);
  local_38 = 0;
  while( true ) {
    peVar1 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&index);
    sVar2 = ComponentEntity::componentCount(&peVar1->super_ComponentEntity);
    if (sVar2 <= local_38) break;
    peVar1 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&index);
    ComponentEntity::component((ComponentEntity *)local_58,(size_t)peVar1);
    std::shared_ptr<libcellml::ComponentEntity>::shared_ptr<libcellml::Component,void>
              (&local_68,(shared_ptr<libcellml::Component> *)&index);
    flattenComponentImports(&local_68,(ComponentPtr *)local_58,local_38);
    std::shared_ptr<libcellml::ComponentEntity>::~shared_ptr(&local_68);
    std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_58)
    ;
    local_38 = local_38 + 1;
  }
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)&index);
  return;
}

Assistant:

void flattenComponentImports(const ComponentEntityPtr &parent, ComponentPtr &component, size_t componentIndex)
{
    auto flattenedComponent = flattenComponent(parent, component, componentIndex);
    for (size_t index = 0; index < flattenedComponent->componentCount(); ++index) {
        auto c = flattenedComponent->component(index);
        flattenComponentImports(flattenedComponent, c, index);
    }
}